

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool aedit_builder(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char cVar6;
  char buf [4608];
  char local_1238 [4616];
  
  cVar1 = *argument;
  if (cVar1 == '\0') {
    send_to_char("Syntax:  builder [$name]  -toggles builder\n\r",ch);
    pcVar4 = "Syntax:  builder All      -allows everyone\n\r";
  }
  else {
    pvVar2 = ch->desc->pEdit;
    cVar6 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar6 = cVar1;
    }
    *argument = cVar6;
    pcVar4 = *(char **)((long)pvVar2 + 0x160);
    pcVar3 = strstr(pcVar4,argument);
    if (pcVar3 == (char *)0x0) {
      local_1238[0] = '\0';
      pcVar3 = strstr(pcVar4,"None");
      if (pcVar3 != (char *)0x0) {
        pcVar4 = string_replace(pcVar4,"None","");
        *(char **)((long)pvVar2 + 0x160) = pcVar4;
        pcVar4 = string_unpad(pcVar4);
        *(char **)((long)pvVar2 + 0x160) = pcVar4;
      }
      if (*pcVar4 != '\0') {
        strcat(local_1238,pcVar4);
        sVar5 = strlen(local_1238);
        (local_1238 + sVar5)[0] = ' ';
        (local_1238 + sVar5)[1] = '\0';
      }
      strcat(local_1238,argument);
      free_pstring(pcVar4);
      pcVar4 = palloc_string(local_1238);
      pcVar4 = string_proper(pcVar4);
      *(char **)((long)pvVar2 + 0x160) = pcVar4;
      pcVar4 = "Builder added.\n\r";
    }
    else {
      pcVar4 = string_replace(pcVar4,argument,"");
      *(char **)((long)pvVar2 + 0x160) = pcVar4;
      pcVar4 = string_unpad(pcVar4);
      *(char **)((long)pvVar2 + 0x160) = pcVar4;
      if (*pcVar4 == '\0') {
        free_pstring(pcVar4);
        pcVar4 = palloc_string("None");
        *(char **)((long)pvVar2 + 0x160) = pcVar4;
      }
      pcVar4 = "Builder removed.\n\r";
    }
  }
  send_to_char(pcVar4,ch);
  return cVar1 != '\0';
}

Assistant:

bool aedit_builder(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];

	EDIT_AREA(ch, pArea);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  builder [$name]  -toggles builder\n\r", ch);
		send_to_char("Syntax:  builder All      -allows everyone\n\r", ch);
		return false;
	}

	argument[0] = UPPER(argument[0]);

	if (strstr(pArea->builders, argument) != (char *)'\0')
	{
		pArea->builders = string_replace(pArea->builders, argument, "\0");
		pArea->builders = string_unpad(pArea->builders);

		if (pArea->builders[0] == '\0')
		{
			free_pstring(pArea->builders);
			pArea->builders = palloc_string("None");
		}

		send_to_char("Builder removed.\n\r", ch);
		return true;
	}
	else
	{
		buf[0] = '\0';

		if (strstr(pArea->builders, "None") != (char *)'\0')
		{
			pArea->builders = string_replace(pArea->builders, "None", "\0");
			pArea->builders = string_unpad(pArea->builders);
		}

		if (pArea->builders[0] != '\0')
		{
			strcat(buf, pArea->builders);
			strcat(buf, " ");
		}

		strcat(buf, argument);
		free_pstring(pArea->builders);
		pArea->builders = string_proper(palloc_string(buf));

		send_to_char("Builder added.\n\r", ch);
		return true;
	}

	return false;
}